

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype)

{
  LogMessage *other;
  ExtensionInfo info;
  LogMessage local_90;
  ExtensionInfo local_58;
  
  if ((type & 0xfe) != 10) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0xc1);
    other = LogMessage::operator<<
                      (&local_90,
                       "CHECK failed: type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP: "
                      );
    LogFinisher::operator=((LogFinisher *)&local_58,other);
    LogMessage::~LogMessage(&local_90);
  }
  local_58.field_5.enum_validity_check.arg = (void *)0x0;
  local_58.descriptor = (FieldDescriptor *)0x0;
  local_58.message = extendee;
  local_58.number = number;
  local_58.type = type;
  local_58.is_repeated = is_repeated;
  local_58.is_packed = is_packed;
  local_58.field_5.enum_validity_check.func = (EnumValidityFuncWithArg *)prototype;
  anon_unknown_26::Register(&local_58);
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype) {
  GOOGLE_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
        type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.message_info = {prototype};
  Register(info);
}